

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O1

void run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
               (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                *A,vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                   *B)

{
  pointer pmVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  key_type local_3c;
  _Base_ptr local_38;
  
  std::
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  ::resize(B,((long)(A->
                    super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(A->
                    super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  pmVar1 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((A->
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pmVar1) {
    uVar4 = 0;
    do {
      p_Var3 = pmVar1[uVar4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var3 != &(A->
                     super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t._M_impl.
                     super__Rb_tree_header._M_header) {
        do {
          local_38 = p_Var3[1]._M_parent;
          local_3c = (key_type)uVar4;
          pmVar2 = std::
                   map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                   ::operator[]((B->
                                super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + p_Var3[1]._M_color,
                                &local_3c);
          *pmVar2 = (mapped_type)local_38;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        } while (p_Var3 != &(A->
                            super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t._M_impl.
                            super__Rb_tree_header._M_header);
      }
      uVar4 = uVar4 + 1;
      pmVar1 = (A->
               super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)(((long)(A->
                                    super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1 >> 4)
                            * -0x5555555555555555));
  }
  do_nothing(B);
  return;
}

Assistant:

void run(std::vector<RowType1> const & A,
         std::vector<RowType2> & B)
{
  B.resize(A.size());

  for (std::size_t i=0; i<A.size(); ++i)
    for (typename RowType1::const_iterator it = A[i].begin(); it != A[i].end(); ++it)
      B[it->first][i] = it->second;

  do_nothing(B);
}